

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O3

int OPENSSL_vasprintf_internal(char **str,char *format,__va_list_tag *args,int system_malloc)

{
  uint uVar1;
  code *pcVar2;
  char *__s;
  char *__s_00;
  int *piVar3;
  code *pcVar4;
  code *pcVar5;
  ulong __maxlen;
  bool bVar6;
  va_list args_copy;
  undefined8 local_48;
  void *pvStack_40;
  void *local_38;
  
  bVar6 = system_malloc != 0;
  pcVar2 = OPENSSL_malloc;
  if (bVar6) {
    pcVar2 = malloc;
  }
  pcVar4 = OPENSSL_free;
  if (bVar6) {
    pcVar4 = free;
  }
  pcVar5 = OPENSSL_realloc;
  if (bVar6) {
    pcVar5 = realloc;
  }
  __s = (char *)(*pcVar2)(0x40);
  if (__s == (char *)0x0) {
    __s = (char *)0x0;
  }
  else {
    local_38 = args->reg_save_area;
    local_48._0_4_ = args->gp_offset;
    local_48._4_4_ = args->fp_offset;
    pvStack_40 = args->overflow_arg_area;
    __maxlen = 0x40;
    uVar1 = vsnprintf(__s,0x40,format,&local_48);
    if (-1 < (int)uVar1) {
      __s_00 = __s;
      if (0x3f < uVar1) {
        __maxlen = (ulong)(uVar1 + 1);
        __s_00 = (char *)(*pcVar5)(__s,__maxlen);
        if (__s_00 == (char *)0x0) goto LAB_00474972;
        uVar1 = vsnprintf(__s_00,__maxlen,format,args);
      }
      __s = __s_00;
      if (uVar1 < __maxlen && -1 < (int)uVar1) {
        *str = __s_00;
        return uVar1;
      }
    }
  }
LAB_00474972:
  (*pcVar4)(__s);
  *str = (char *)0x0;
  piVar3 = __errno_location();
  *piVar3 = 0xc;
  return -1;
}

Assistant:

int OPENSSL_vasprintf_internal(char **str, const char *format, va_list args,
                               int system_malloc) {
  void *(*allocate)(size_t) = system_malloc ? malloc : OPENSSL_malloc;
  void (*deallocate)(void *) = system_malloc ? free : OPENSSL_free;
  void *(*reallocate)(void *, size_t) =
      system_malloc ? realloc : OPENSSL_realloc;
  char *candidate = NULL;
  size_t candidate_len = 64;  // TODO(bbe) what's the best initial size?
  int ret;

  if ((candidate = reinterpret_cast<char *>(allocate(candidate_len))) == NULL) {
    goto err;
  }
  va_list args_copy;
  va_copy(args_copy, args);
  ret = vsnprintf(candidate, candidate_len, format, args_copy);
  va_end(args_copy);
  if (ret < 0) {
    goto err;
  }
  if ((size_t)ret >= candidate_len) {
    // Too big to fit in allocation.
    char *tmp;

    candidate_len = (size_t)ret + 1;
    if ((tmp = reinterpret_cast<char *>(
             reallocate(candidate, candidate_len))) == NULL) {
      goto err;
    }
    candidate = tmp;
    ret = vsnprintf(candidate, candidate_len, format, args);
  }
  // At this point this should not happen unless vsnprintf is insane.
  if (ret < 0 || (size_t)ret >= candidate_len) {
    goto err;
  }
  *str = candidate;
  return ret;

err:
  deallocate(candidate);
  *str = NULL;
  errno = ENOMEM;
  return -1;
}